

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableAnalyzerSubprocess.cpp
# Opt level: O3

bool __thiscall
EnrichableAnalyzerSubprocess::GetFeatureEnablement(EnrichableAnalyzerSubprocess *this,char *feature)

{
  ushort uVar1;
  size_t sVar2;
  char result [16];
  string value;
  stringstream outputStream;
  char local_208 [2];
  char cStack_206;
  char *local_1f0;
  undefined8 local_1e8;
  char local_1e0 [16];
  string local_1d0;
  undefined7 uStack_1cf;
  undefined1 local_1c0 [16];
  stringstream local_1b0 [16];
  long local_1a0 [14];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  local_1e8 = 0;
  local_1e0[0] = '\0';
  local_1f0 = local_1e0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"feature",7);
  local_1d0 = (string)0x9;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,(char *)&local_1d0,1);
  if (feature == (char *)0x0) {
    std::ios::clear((int)(ostream *)local_1a0 + (int)*(undefined8 *)(local_1a0[0] + -0x18));
  }
  else {
    sVar2 = strlen(feature);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,feature,sVar2);
  }
  local_1d0 = (string)0xa;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,(char *)&local_1d0,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1f0,&local_1d0);
  if ((undefined1 *)CONCAT71(uStack_1cf,local_1d0) != local_1c0) {
    operator_delete((undefined1 *)CONCAT71(uStack_1cf,local_1d0));
  }
  GetScriptResponse(this,local_1f0,(uint)local_1e8,local_208,0x10);
  uVar1 = (ushort)_local_208 ^ 0x6f6e;
  if (cStack_206 == '\0' && uVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"message type \"",0xe);
    if (feature == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x113548);
    }
    else {
      sVar2 = strlen(feature);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,feature,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\" disabled\n",0xb);
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0);
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return cStack_206 != '\0' || uVar1 != 0;
}

Assistant:

bool EnrichableAnalyzerSubprocess::GetFeatureEnablement(const char* feature) {
	std::stringstream outputStream;
	char result[16];
	std::string value;

	outputStream << FEATURE_PREFIX;
	outputStream << UNIT_SEPARATOR;
	outputStream << feature;
	outputStream << LINE_SEPARATOR;
	value = outputStream.str();

	GetScriptResponse(
		value.c_str(),
		value.length(),
		result,
		16
	);
	if(strcmp(result, "no") == 0) {
		std::cerr << "message type \"";
		std::cerr << feature;
		std::cerr << "\" disabled\n";
		return false;
	}
	return true;
}